

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O2

void * large_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t usize,size_t alignment,_Bool zero,
                   tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  void *ptr_00;
  ulong uVar4;
  undefined8 uVar5;
  cache_bin_info_t *pcVar6;
  _Bool _Var7;
  szind_t binind;
  uint uVar8;
  ulong uVar9;
  rtree_leaf_elm_t *prVar10;
  void *result;
  ulong *puVar11;
  ulong uVar12;
  uintptr_t uVar13;
  rtree_ctx_t *prVar14;
  long lVar15;
  extent_t *extent;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    prVar14 = &rtree_ctx_fallback;
    rtree_ctx_data_init(prVar14);
  }
  else {
    prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar9 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar11 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar12);
  uVar12 = *(ulong *)((long)&prVar14->cache[0].leafkey + uVar12);
  if (uVar12 == uVar9) {
    prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar11[1]);
  }
  else if (prVar14->l2_cache[0].leafkey == uVar9) {
    prVar10 = prVar14->l2_cache[0].leaf;
    prVar14->l2_cache[0].leafkey = uVar12;
    prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar11[1];
    *puVar11 = uVar9;
    puVar11[1] = (ulong)prVar10;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    for (lVar15 = 0x118; lVar15 != 0x188; lVar15 = lVar15 + 0x10) {
      if (*(ulong *)((long)prVar14->cache + lVar15 + -8) == uVar9) {
        uVar4 = *(ulong *)((long)&prVar14->cache[0].leafkey + lVar15);
        puVar1 = (undefined8 *)((long)prVar14->cache + lVar15 + -0x18);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)prVar14->cache + lVar15 + -8);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        *(ulong *)((long)prVar14->cache + lVar15 + -0x18) = uVar12;
        *(ulong *)((long)(prVar14->cache + -1) + lVar15) = puVar11[1];
        *puVar11 = uVar9;
        puVar11[1] = uVar4;
        prVar10 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar4);
        goto LAB_00130e80;
      }
    }
    prVar10 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar14,(uintptr_t)ptr,true,false);
  }
LAB_00130e80:
  extent = (extent_t *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  uVar12 = *(ulong *)((long)sz_index2size_tab + (ulong)((uint)extent->e_bits >> 0xf & 0x7f8));
  _Var7 = large_ralloc_no_move(tsdn,extent,usize,usize,zero);
  if (!_Var7) {
    hook_invoke_expand(hook_args->is_realloc ^ hook_expand_rallocx,ptr,uVar12,usize,(uintptr_t)ptr,
                       hook_args->args);
    return extent->e_addr;
  }
  if (alignment < 0x41) {
    result = large_malloc(tsdn,arena,usize,zero);
  }
  else {
    result = large_palloc(tsdn,arena,usize,alignment,zero);
  }
  if (result == (void *)0x0) {
    return (void *)0x0;
  }
  hook_invoke_alloc(hook_alloc_rallocx - hook_args->is_realloc,result,(uintptr_t)result,
                    hook_args->args);
  hook_invoke_dalloc(hook_dalloc_rallocx - hook_args->is_realloc,ptr,hook_args->args);
  if (uVar12 < usize) {
    usize = uVar12;
  }
  memcpy(result,extent->e_addr,usize);
  ptr_00 = extent->e_addr;
  if (tcache == (tcache_t *)0x0) {
    if (uVar12 < 0x1001) {
      uVar8 = (uint)sz_size2index_tab[uVar12 + 7 >> 3];
    }
    else {
      uVar8 = sz_size2index_compute(uVar12);
    }
    if (uVar8 < 0x24) {
      arena_dalloc_small(tsdn,ptr_00);
      return result;
    }
    if (tsdn == (tsdn_t *)0x0) {
      prVar14 = &rtree_ctx_fallback;
      rtree_ctx_data_init(prVar14);
    }
    else {
      prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar12 = (ulong)ptr_00 & 0xffffffffc0000000;
    uVar9 = (ulong)(((uint)((ulong)ptr_00 >> 0x1e) & 0xf) << 4);
    puVar11 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar9);
    uVar13 = *(uintptr_t *)((long)&prVar14->cache[0].leafkey + uVar9);
    if (uVar13 == uVar12) {
LAB_0013120a:
      prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr_00 >> 9) & 0x1ffff8) + puVar11[1]);
      goto LAB_00131219;
    }
    if (prVar14->l2_cache[0].leafkey != uVar12) {
      for (lVar15 = 0x118; lVar15 != 0x188; lVar15 = lVar15 + 0x10) {
        if (*(ulong *)((long)prVar14->cache + lVar15 + -8) == uVar12) goto LAB_001313e0;
      }
LAB_00131416:
      prVar10 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,prVar14,(uintptr_t)ptr_00,true,false)
      ;
      goto LAB_00131219;
    }
  }
  else {
    if (uVar12 < 0x1001) {
      binind = (szind_t)sz_size2index_tab[uVar12 + 7 >> 3];
    }
    else {
      binind = sz_size2index_compute(uVar12);
    }
    if (binind < 0x24) {
      if (opt_junk_free != false) {
        arena_dalloc_junk_small_impl(ptr_00,bin_infos + binind);
      }
      pcVar6 = tcache_bin_info;
      uVar8 = tcache->bins_small[binind].ncached;
      if (uVar8 == tcache_bin_info[binind].ncached_max) {
        tcache_bin_flush_small(&tsdn->tsd,tcache,tcache->bins_small + binind,binind,(int)uVar8 >> 1)
        ;
        uVar8 = tcache->bins_small[binind].ncached;
        if (uVar8 != pcVar6[binind].ncached_max) goto LAB_00130ff8;
      }
      else {
LAB_00130ff8:
        tcache->bins_small[binind].ncached = uVar8 + 1;
        tcache->bins_small[binind].avail[(int)~uVar8] = ptr_00;
      }
      iVar3 = (tcache->gc_ticker).tick;
      (tcache->gc_ticker).tick = iVar3 + -1;
      if (0 < iVar3) {
        return result;
      }
      (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
LAB_001311c7:
      tcache_event_hard(&tsdn->tsd,tcache);
      return result;
    }
    if (binind < nhbins) {
      if (opt_junk_free == true) {
        memset(ptr_00,0x5a,sz_index2size_tab[binind]);
      }
      uVar8 = tcache->bins_small[(ulong)binind + 5].ncached;
      if (uVar8 == tcache_bin_info[binind].ncached_max) {
        tcache_bin_flush_large
                  (&tsdn->tsd,tcache->bins_small + (ulong)binind + 5,binind,(int)uVar8 >> 1,tcache);
        uVar8 = tcache->bins_small[(ulong)binind + 5].ncached;
      }
      tcache->bins_small[(ulong)binind + 5].ncached = uVar8 + 1;
      tcache->bins_small[(ulong)binind + 5].avail[(int)~uVar8] = ptr_00;
      iVar3 = (tcache->gc_ticker).tick;
      (tcache->gc_ticker).tick = iVar3 + -1;
      if (0 < iVar3) {
        return result;
      }
      (tcache->gc_ticker).tick = (tcache->gc_ticker).nticks;
      goto LAB_001311c7;
    }
    if (tsdn == (tsdn_t *)0x0) {
      prVar14 = &rtree_ctx_fallback;
      rtree_ctx_data_init(prVar14);
    }
    else {
      prVar14 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    uVar12 = (ulong)ptr_00 & 0xffffffffc0000000;
    uVar9 = (ulong)(((uint)((ulong)ptr_00 >> 0x1e) & 0xf) << 4);
    puVar11 = (ulong *)((long)&prVar14->cache[0].leafkey + uVar9);
    uVar13 = *(uintptr_t *)((long)&prVar14->cache[0].leafkey + uVar9);
    if (uVar13 == uVar12) goto LAB_0013120a;
    if (prVar14->l2_cache[0].leafkey != uVar12) {
      for (lVar15 = 0x118; lVar15 != 0x188; lVar15 = lVar15 + 0x10) {
        if (*(ulong *)((long)prVar14->cache + lVar15 + -8) == uVar12) goto LAB_001313e0;
      }
      goto LAB_00131416;
    }
  }
  prVar10 = prVar14->l2_cache[0].leaf;
  prVar14->l2_cache[0].leafkey = uVar13;
  prVar14->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar11[1];
  *puVar11 = (ulong)ptr_00 & 0xffffffffc0000000;
  puVar11[1] = (ulong)prVar10;
  prVar10 = (rtree_leaf_elm_t *)
            ((long)&(prVar10->le_bits).repr + (ulong)((uint)ptr_00 >> 9 & 0x1ffff8));
LAB_00131219:
  large_dalloc(tsdn,(extent_t *)
                    (((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe));
  return result;
LAB_001313e0:
  uVar12 = *(ulong *)((long)&prVar14->cache[0].leafkey + lVar15);
  puVar1 = (undefined8 *)((long)prVar14->cache + lVar15 + -0x18);
  uVar5 = puVar1[1];
  puVar2 = (undefined8 *)((long)prVar14->cache + lVar15 + -8);
  *puVar2 = *puVar1;
  puVar2[1] = uVar5;
  *(uintptr_t *)((long)prVar14->cache + lVar15 + -0x18) = uVar13;
  *(ulong *)((long)(prVar14->cache + -1) + lVar15) = puVar11[1];
  *puVar11 = (ulong)ptr_00 & 0xffffffffc0000000;
  puVar11[1] = uVar12;
  prVar10 = (rtree_leaf_elm_t *)(((uint)ptr_00 >> 9 & 0x1ffff8) + uVar12);
  goto LAB_00131219;
}

Assistant:

void *
large_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t usize,
    size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	extent_t *extent = iealloc(tsdn, ptr);

	size_t oldusize = extent_usize_get(extent);
	/* The following should have been caught by callers. */
	assert(usize > 0 && usize <= SC_LARGE_MAXCLASS);
	/* Both allocation sizes must be large to avoid a move. */
	assert(oldusize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS);

	/* Try to avoid moving the allocation. */
	if (!large_ralloc_no_move(tsdn, extent, usize, usize, zero)) {
		hook_invoke_expand(hook_args->is_realloc
		    ? hook_expand_realloc : hook_expand_rallocx, ptr, oldusize,
		    usize, (uintptr_t)ptr, hook_args->args);
		return extent_addr_get(extent);
	}

	/*
	 * usize and old size are different enough that we need to use a
	 * different size class.  In that case, fall back to allocating new
	 * space and copying.
	 */
	void *ret = large_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	size_t copysize = (usize < oldusize) ? usize : oldusize;
	memcpy(ret, extent_addr_get(extent), copysize);
	isdalloct(tsdn, extent_addr_get(extent), oldusize, tcache, NULL, true);
	return ret;
}